

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_3::RgbaYca::reconstructChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  float f;
  float fVar1;
  int i;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    f = Imath_3_1::half::operator_cast_to_float
                  ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    fVar1 = Imath_3_1::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff80 = f * 0.002128 + fVar1 * -0.00754;
    fVar1 = Imath_3_1::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff84 = fVar1 * 0.019597 + in_stack_ffffffffffffff80;
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator=
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),f);
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator_cast_to_float
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Imath_3_1::half::operator=
              ((half *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),f);
    *(undefined2 *)(in_RDX + 2 + (long)local_1c * 8) =
         *(undefined2 *)(*(long *)(in_RSI + 0x68) + 2 + (long)local_1c * 8);
    *(undefined2 *)(in_RDX + 6 + (long)local_1c * 8) =
         *(undefined2 *)(*(long *)(in_RSI + 0x68) + 6 + (long)local_1c * 8);
  }
  return;
}

Assistant:

void
reconstructChromaVert (int n, const Rgba* const ycaIn[N], Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].r = ycaIn[0][i].r * 0.002128f + ycaIn[2][i].r * -0.007540f +
                      ycaIn[4][i].r * 0.019597f + ycaIn[6][i].r * -0.043159f +
                      ycaIn[8][i].r * 0.087929f + ycaIn[10][i].r * -0.186077f +
                      ycaIn[12][i].r * 0.627123f + ycaIn[14][i].r * 0.627123f +
                      ycaIn[16][i].r * -0.186077f + ycaIn[18][i].r * 0.087929f +
                      ycaIn[20][i].r * -0.043159f + ycaIn[22][i].r * 0.019597f +
                      ycaIn[24][i].r * -0.007540f + ycaIn[26][i].r * 0.002128f;

        ycaOut[i].b = ycaIn[0][i].b * 0.002128f + ycaIn[2][i].b * -0.007540f +
                      ycaIn[4][i].b * 0.019597f + ycaIn[6][i].b * -0.043159f +
                      ycaIn[8][i].b * 0.087929f + ycaIn[10][i].b * -0.186077f +
                      ycaIn[12][i].b * 0.627123f + ycaIn[14][i].b * 0.627123f +
                      ycaIn[16][i].b * -0.186077f + ycaIn[18][i].b * 0.087929f +
                      ycaIn[20][i].b * -0.043159f + ycaIn[22][i].b * 0.019597f +
                      ycaIn[24][i].b * -0.007540f + ycaIn[26][i].b * 0.002128f;

        ycaOut[i].g = ycaIn[13][i].g;
        ycaOut[i].a = ycaIn[13][i].a;
    }
}